

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ScrollableWindow.cpp
# Opt level: O2

size_t __thiscall cursespp::ScrollableWindow::GetPreviousPageEntryIndex(ScrollableWindow *this)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  size_t sVar5;
  uint uVar6;
  EntryPtr entry;
  long *local_48;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_40;
  long local_38;
  
  iVar1 = (*(this->super_Window).super_IWindow.super_IOrderable._vptr_IOrderable[0x42])();
  iVar2 = (*(this->super_Window).super_IWindow.super_IOrderable._vptr_IOrderable[0x18])(this);
  iVar3 = (*(this->super_Window).super_IWindow.super_IOrderable._vptr_IOrderable[0x19])(this);
  iVar4 = (*(this->super_Window).super_IWindow.super_IOrderable._vptr_IOrderable[0x41])(this);
  uVar6 = *(uint *)CONCAT44(extraout_var_00,iVar4);
  local_38 = (long)iVar3;
  do {
    iVar3 = iVar2;
    if ((int)uVar6 < 0) goto LAB_001922ce;
    (**(code **)(*(long *)CONCAT44(extraout_var,iVar1) + 0x20))
              (&local_48,(long *)CONCAT44(extraout_var,iVar1),this,uVar6);
    (**(code **)(*local_48 + 0x20))(local_48,local_38);
    iVar4 = (**(code **)(*local_48 + 0x10))();
    iVar2 = iVar4;
    if (iVar3 < iVar4) {
      iVar2 = 0;
    }
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_40);
    uVar6 = uVar6 - 1;
    iVar2 = iVar3 - iVar2;
  } while (iVar4 <= iVar3);
  uVar6 = (uVar6 - (iVar4 <= iVar3)) + 1;
LAB_001922ce:
  sVar5 = 0;
  if (0 < (int)uVar6) {
    sVar5 = (size_t)uVar6;
  }
  return sVar5;
}

Assistant:

size_t ScrollableWindow::GetPreviousPageEntryIndex() {
    IScrollAdapter* adapter = &GetScrollAdapter();
    int remaining = this->GetContentHeight();
    int width = this->GetContentWidth();

    int i = this->GetScrollPosition().firstVisibleEntryIndex;
    while (i >= 0) {
        IScrollAdapter::EntryPtr entry = adapter->GetEntry(this, i);
        entry->SetWidth(width);

        int count = entry->GetLineCount();
        if (count > remaining) {
            break;
        }

        i--;
        remaining -= count;
    }

    return std::max(0, i);
}